

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BplusTree.hpp
# Opt level: O3

bool __thiscall
sjtu::BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_>::insert
          (BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_> *this,
          value_type *value)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  locType *pos;
  node **p;
  int *pp;
  undefined4 extraout_var;
  uint *puVar5;
  undefined4 extraout_var_01;
  ulong uVar6;
  long lVar7;
  int iVar8;
  locType extraout_RDX;
  locType extraout_RDX_00;
  long lVar9;
  locType *plVar10;
  uint uVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  node **ppnVar15;
  pair<sjtu::BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_>::node_*,_long>
  lnk;
  uint tmpv [100];
  unsigned_long_long tmpk [100];
  locType local_4f8;
  int local_4ec;
  uint local_4e8;
  undefined1 local_4e4 [396];
  ulong local_358;
  undefined1 local_350 [800];
  node *pnVar4;
  undefined4 extraout_var_00;
  
  uVar6 = value->first;
  uVar3 = value->second;
  iVar2 = this->depth;
  lVar12 = (long)iVar2;
  if (lVar12 == 0) {
    iVar2 = (*(this->file->
              super_FileManager_Base<sjtu::BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_>::node>
              )._vptr_FileManager_Base[1])();
    puVar5 = (uint *)CONCAT44(extraout_var_00,iVar2);
    this->root = extraout_RDX;
    this->depth = 1;
    puVar5[400] = 1;
    *(ulong *)(puVar5 + 0xca) = uVar6;
    *puVar5 = uVar3;
    puVar5[200] = 0xffffffff;
    puVar5[0xc9] = 0xffffffff;
    (*(this->file->
      super_FileManager_Base<sjtu::BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_>::node>
      )._vptr_FileManager_Base[3])(this->file,&this->root);
    this->siz = 1;
    return true;
  }
  uVar14 = lVar12 * 8;
  if (iVar2 < 0) {
    uVar14 = 0xffffffffffffffff;
  }
  uVar13 = lVar12 * 4;
  if (iVar2 < 0) {
    uVar13 = 0xffffffffffffffff;
  }
  pos = (locType *)operator_new__(uVar14);
  *pos = 0;
  p = (node **)operator_new__(uVar14);
  pp = (int *)operator_new__(uVar13);
  *pos = this->root;
  if (iVar2 < 1) {
    ppnVar15 = p + lVar12 + -1;
LAB_0010c237:
    pnVar4 = *ppnVar15;
    iVar8 = pnVar4->sz;
    uVar11 = 0;
  }
  else {
    lVar12 = 0;
    do {
      iVar2 = (*(this->file->
                super_FileManager_Base<sjtu::BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_>::node>
                )._vptr_FileManager_Base[2])(this->file,pos + lVar12);
      pnVar4 = (node *)CONCAT44(extraout_var,iVar2);
      p[lVar12] = pnVar4;
      uVar11 = pnVar4->sz;
      uVar14 = 0;
      if (0 < (long)(int)uVar11) {
        uVar14 = 0;
        do {
          if (uVar6 <= pnVar4->keyvalue[uVar14]) {
            iVar2 = this->depth;
            if ((long)iVar2 + -1 <= lVar12) goto LAB_0010c14a;
            uVar14 = (ulong)(((int)uVar14 + 1) - (uint)(uVar6 < pnVar4->keyvalue[uVar14]));
            goto LAB_0010c13f;
          }
          uVar14 = uVar14 + 1;
        } while ((long)(int)uVar11 != uVar14);
        uVar14 = (ulong)uVar11;
      }
      iVar2 = this->depth;
      if (lVar12 < (long)iVar2 + -1) {
LAB_0010c13f:
        (pos + lVar12)[1] = (pnVar4->field_0).pointer[(int)uVar14];
      }
LAB_0010c14a:
      uVar11 = (uint)uVar14;
      pp[lVar12] = uVar11;
      lVar12 = lVar12 + 1;
      lVar9 = (long)iVar2;
    } while (lVar12 < lVar9);
    pnVar4 = p[lVar9 + -1];
    iVar8 = pnVar4->sz;
    if (((int)uVar11 < iVar8) && (pnVar4->keyvalue[(int)uVar11] <= uVar6)) {
      operator_delete__(p);
      operator_delete__(pp);
      operator_delete__(pos);
      return false;
    }
    ppnVar15 = p + lVar9 + -1;
    if ((uVar11 == 0) && (uVar11 = 0, 1 < iVar2)) {
      plVar10 = pos + (iVar2 - 2);
      lVar12 = (ulong)(iVar2 - 2) + 1;
      do {
        lVar9 = (long)pp[lVar12 + -1];
        if ((lVar9 != 0) && (p[lVar12 + -1]->keyvalue[lVar9 + -1] == pnVar4->keyvalue[0])) {
          p[lVar12 + -1]->keyvalue[lVar9 + -1] = uVar6;
          (*(this->file->
            super_FileManager_Base<sjtu::BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_>::node>
            )._vptr_FileManager_Base[3])(this->file,plVar10);
          goto LAB_0010c237;
        }
        plVar10 = plVar10 + -1;
        lVar9 = lVar12 + -1;
        bVar1 = 0 < lVar12;
        lVar12 = lVar9;
      } while (lVar9 != 0 && bVar1);
    }
  }
  if (iVar8 < 99) {
    if ((int)uVar11 < iVar8) {
      lVar12 = (long)iVar8;
      do {
        pnVar4 = *ppnVar15;
        pnVar4->keyvalue[lVar12] = pnVar4->keyvalue[lVar12 + -1];
        (pnVar4->field_0).val[lVar12] = *(uint *)((long)pnVar4 + lVar12 * 4 + -4);
        lVar12 = lVar12 + -1;
      } while ((int)uVar11 < lVar12);
      pnVar4 = *ppnVar15;
    }
    pnVar4->keyvalue[(int)uVar11] = uVar6;
    (pnVar4->field_0).val[(int)uVar11] = uVar3;
    (*ppnVar15)->sz = (*ppnVar15)->sz + 1;
    (*(this->file->
      super_FileManager_Base<sjtu::BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_>::node>
      )._vptr_FileManager_Base[3])(this->file,pos + (long)this->depth + -1);
    goto LAB_0010c4c7;
  }
  iVar2 = (*(this->file->
            super_FileManager_Base<sjtu::BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_>::node>
            )._vptr_FileManager_Base[1])();
  lVar12 = CONCAT44(extraout_var_01,iVar2);
  pnVar4 = *ppnVar15;
  local_4f8 = extraout_RDX_00;
  if ((int)uVar11 < 1) {
    uVar14 = (ulong)(int)uVar11;
    *(uint *)(local_4e4 + uVar14 * 4 + -4) = uVar3;
    *(ulong *)(local_350 + uVar14 * 8 + -8) = uVar6;
LAB_0010c360:
    memcpy(local_4e4 + uVar14 * 4,(void *)((long)&pnVar4->field_0 + uVar14 * 4),
           (ulong)(0x62 - uVar11) * 4 + 4);
    memcpy(local_350 + uVar14 * 8,pnVar4->keyvalue + uVar14,(ulong)(0x62 - uVar11) * 8 + 8);
  }
  else {
    uVar14 = (ulong)uVar11;
    memcpy(&local_4e8,pnVar4,uVar14 * 4);
    memcpy(&local_358,pnVar4->keyvalue,uVar14 * 8);
    *(uint *)(local_4e4 + uVar14 * 4 + -4) = uVar3;
    *(ulong *)(local_350 + uVar14 * 8 + -8) = uVar6;
    if (uVar11 < 99) goto LAB_0010c360;
  }
  *(locType *)(lVar12 + 800) = pnVar4->nxt;
  pnVar4->sz = 0x32;
  lVar9 = 0;
  do {
    (pnVar4->field_0).val[lVar9] = *(uint *)(local_4e4 + lVar9 * 4 + -4);
    pnVar4 = *ppnVar15;
    pnVar4->keyvalue[lVar9] = *(unsigned_long_long *)(local_350 + lVar9 * 8 + -8);
    lVar9 = lVar9 + 1;
    uVar3 = pnVar4->sz;
    uVar6 = (ulong)uVar3;
    lVar7 = (long)(int)uVar3;
  } while (lVar9 < lVar7);
  pnVar4->nxt = extraout_RDX_00;
  if ((int)uVar3 < 100) {
    do {
      *(undefined4 *)(lVar12 + (long)(int)uVar6 * -4 + lVar7 * 4) =
           *(undefined4 *)(local_4e4 + lVar7 * 4 + -4);
      uVar3 = (*ppnVar15)->sz;
      uVar6 = (ulong)(int)uVar3;
      *(undefined8 *)(lVar12 + uVar6 * -8 + 0x328 + lVar7 * 8) =
           *(undefined8 *)(local_350 + lVar7 * 8 + -8);
      lVar7 = lVar7 + 1;
    } while ((int)lVar7 != 100);
  }
  *(uint *)(lVar12 + 0x640) = 100 - uVar3;
  (*(this->file->
    super_FileManager_Base<sjtu::BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_>::node>
    )._vptr_FileManager_Base[3])(this->file,&local_4f8);
  (*(this->file->
    super_FileManager_Base<sjtu::BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_>::node>
    )._vptr_FileManager_Base[3])(this->file,pos + (long)this->depth + -1);
  local_4ec = this->depth + -2;
  insertnonleaf(this,(unsigned_long_long *)(lVar12 + 0x328),&local_4ec,p,pp,pos,local_4f8);
LAB_0010c4c7:
  operator_delete__(p);
  operator_delete__(pp);
  operator_delete__(pos);
  this->siz = this->siz + 1;
  return true;
}

Assistant:

bool insert(const value_type &value) {
            Key vkey = value.first;
            T vt = value.second;
            int i, j;
            if (!depth) {
                auto lnk = file->newspace();
                node *x = lnk.first;
                root = lnk.second;
                depth = 1;
                x->sz = 1;
                x->keyvalue[0] = vkey;
                x->val[0] = vt;
                x->nxt = -1;
                file->save(root);
                siz=1;
                return 1;
            }
            locType *pos;
            node **p;
            int *pp;
            pos = new locType[depth];
            memset(pos, 0, sizeof pos);
            p = new node *[depth];
            pp = new int[depth];
            pos[0] = root;
            for (i = 0; i < depth; ++i) {
                p[i] = file->read(pos[i]);
                for (j = 0; j < p[i]->sz && Compare()(p[i]->keyvalue[j], vkey); ++j);
                if (i < depth - 1) {
                    if (j < p[i]->sz && !Compare()(vkey, p[i]->keyvalue[j]))++j;
                    pos[i + 1] = p[i]->pointer[j];
                }
                pp[i] = j;
            }
            if (j < p[depth - 1]->sz && !Compare()(vkey, p[depth - 1]->keyvalue[j])) {
                delete[]p;
                delete[]pp;
                delete[]pos;
                return 0;
            }
            node *&x = p[depth - 1];
            if (!j) {
                for (i = depth - 2; i >= 0; --i)
                    if (pp[i] && equal(x->keyvalue[0], p[i]->keyvalue[pp[i] - 1])) {
                        p[i]->keyvalue[pp[i] - 1] = vkey;
                        file->save(pos[i]);
                        break;
                    }
            }
            if (x->sz < degree - 1) {
                for (i = x->sz; i > j; --i)x->keyvalue[i] = x->keyvalue[i - 1], x->val[i] = x->val[i - 1];
                x->keyvalue[j] = vkey;
                x->val[j] = vt;
                ++x->sz;
                file->save(pos[depth - 1]);
            } else {
                T tmpv[degree];
                Key tmpk[degree];
                auto lnk = file->newspace();
                node *y = lnk.first;
                for (i = 0; i < j; ++i)tmpv[i] = x->val[i], tmpk[i] = x->keyvalue[i];
                tmpv[j] = vt;
                tmpk[j] = vkey;
                for (i = j + 1; i < degree; ++i)tmpv[i] = x->val[i - 1], tmpk[i] = x->keyvalue[i - 1];
                y->nxt = x->nxt;
                x->sz = degree >> 1;
                for (i = 0; i < x->sz; ++i)x->val[i] = tmpv[i], x->keyvalue[i] = tmpk[i];
                x->nxt = lnk.second;
                for (i = x->sz; i < degree; ++i)y->val[i - x->sz] = tmpv[i], y->keyvalue[i - x->sz] = tmpk[i];
                y->sz = degree - x->sz;
                file->save(lnk.second);
                file->save(pos[depth - 1]);
                insertnonleaf(y->keyvalue[0], depth - 2, p, pp, pos, lnk.second);
            }
            delete[]p;
            delete[]pp;
            delete[]pos;
            ++siz;
            return 1;
        }